

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O1

int Min_CoverSuppVarNum(Min_Man_t *p,Min_Cube_t *pCover)

{
  uint *puVar1;
  Min_Cube_t *pMVar2;
  Min_Cube_t **ppMVar3;
  int iVar4;
  Min_Cube_t *pMVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  
  iVar4 = 0;
  if (pCover != (Min_Cube_t *)0x0) {
    pMVar5 = pCover;
    if ((*(ushort *)&pCover->field_0x9 & 0x3ffc) != 0) {
      pMVar2 = p->pTemp;
      uVar7 = 0;
      do {
        pMVar2->uData[uVar7] = 0xffffffff;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (*(uint *)&pCover->field_0x8 >> 10 & 0xfff));
    }
    do {
      if ((*(ushort *)&pCover->field_0x9 & 0x3ffc) != 0) {
        pMVar2 = p->pTemp;
        uVar7 = 0;
        do {
          puVar1 = pMVar2->uData + uVar7;
          *puVar1 = *puVar1 & pMVar5->uData[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 < (*(uint *)&pCover->field_0x8 >> 10 & 0xfff));
      }
      ppMVar3 = &pMVar5->pNext;
      pMVar5 = *ppMVar3;
    } while (*ppMVar3 != (Min_Cube_t *)0x0);
    uVar6 = *(uint *)&pCover->field_0x8 & 0x3ff;
    iVar4 = 0;
    if (uVar6 != 0) {
      bVar8 = 0;
      iVar4 = 0;
      uVar9 = 0;
      do {
        iVar4 = (iVar4 + 1) - (uint)((~(p->pTemp->uData[uVar9 >> 4] >> (bVar8 & 0x1e)) & 3) == 0);
        uVar9 = uVar9 + 1;
        bVar8 = bVar8 + 2;
      } while (uVar6 != uVar9);
    }
  }
  return iVar4;
}

Assistant:

int Min_CoverSuppVarNum( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube;
    int i, Counter;
    if ( pCover == NULL )
        return 0;
    // clean the cube
    for ( i = 0; i < (int)pCover->nWords; i++ )
        p->pTemp->uData[i]  = ~((unsigned)0);
    // add the bit data
    Min_CoverForEachCube( pCover, pCube )
        for ( i = 0; i < (int)pCover->nWords; i++ )
            p->pTemp->uData[i] &= pCube->uData[i];
    // count the vars
    Counter = 0;
    for ( i = 0; i < (int)pCover->nVars; i++ )
        Counter += ( Min_CubeGetVar(p->pTemp, i) != 3 );
    return Counter;
}